

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block1394.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  FILE *__stream;
  quadlet_t *__ptr;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  undefined4 extraout_var;
  ulong uVar7;
  undefined8 uVar8;
  uint *puVar9;
  long lVar10;
  int iVar11;
  char *pcVar12;
  long lVar13;
  uint uVar14;
  size_t sStack_70;
  uint local_58;
  quadlet_t data1;
  quadlet_t *local_50;
  ulong local_48;
  ulonglong local_40;
  char *local_38;
  
  signal(2,signal_handler);
  local_38 = strstr(*argv,"quad1394");
  local_50 = &data1;
  local_58 = 0;
  local_48 = 0;
  uVar7 = 1;
  uVar14 = 0;
  bVar2 = false;
  iVar11 = 0;
  for (lVar13 = 1; iVar3 = (int)uVar7, lVar13 < argc; lVar13 = lVar13 + 1) {
    pcVar12 = argv[lVar13];
    if (*pcVar12 == '-') {
      cVar1 = pcVar12[1];
      if (cVar1 == 'd') {
        bVar2 = true;
      }
      else {
        if (cVar1 == 'n') {
          iVar3 = atoi(pcVar12 + 2);
          local_48 = CONCAT44(extraout_var,iVar3);
          pcVar12 = "Selecting node %d\n";
        }
        else {
          if (cVar1 != 'p') goto LAB_001014bc;
          local_58 = atoi(pcVar12 + 2);
          pcVar12 = "Selecting port %d\n";
        }
        printf(pcVar12);
      }
    }
    else {
      if (uVar14 == 0) {
        local_40 = strtoull(pcVar12,(char **)0x0,0x10);
      }
      else if (uVar14 == 1 && local_38 != (char *)0x0) {
        uVar6 = strtoul(pcVar12,(char **)0x0,0x10);
        uVar4 = (uint)uVar6;
        data1 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      }
      else if (uVar14 == 1 && local_38 == (char *)0x0) {
        uVar7 = strtoul(pcVar12,(char **)0x0,10);
        local_50 = (quadlet_t *)calloc(4,(long)(int)uVar7);
        if (local_50 == (quadlet_t *)0x0) {
          pcVar12 = "Failed to allocate memory for %d quadlets";
          uVar7 = uVar7 & 0xffffffff;
          goto LAB_001017b9;
        }
      }
      else if ((local_38 == (char *)0x0) && (iVar11 < iVar3)) {
        uVar6 = strtoul(pcVar12,(char **)0x0,0x10);
        uVar4 = (uint)uVar6;
        lVar10 = (long)iVar11;
        iVar11 = iVar11 + 1;
        local_50[lVar10] =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      }
      else {
        fprintf(_stderr,"Warning: extra parameter: %s\n");
      }
      uVar14 = uVar14 + 1;
    }
LAB_001014bc:
  }
  if ((int)uVar14 < 1) {
    pcVar12 = 
    "Usage: %s [-pP] [-nN] <address in hex> <size in quadlets> [write data quadlets in hex]\n";
    if (local_38 != (char *)0x0) {
      pcVar12 = "Usage: %s [-pP] [-nN] <address in hex> [value to write in hex]\n";
    }
    printf(pcVar12,*argv);
    puts("       where P = port number, N = node number");
    exit(0);
  }
  handle = (raw1394handle_t)raw1394_new_handle();
  pcVar12 = local_38;
  if (handle == (raw1394handle_t)0x0) {
    pcVar12 = "**** Error: could not open 1394 handle\n";
    sStack_70 = 0x27;
  }
  else {
    raw1394_set_bus_reset_handler(handle,reset_handler);
    uVar4 = raw1394_get_port_info(handle,0,0);
    if (-1 < (int)uVar4) {
      if (local_58 < uVar4) {
        iVar11 = raw1394_set_port(handle,local_58);
        if (iVar11 != 0) {
          pcVar12 = "**** Error setting port %d\n";
          uVar7 = (ulong)local_58;
LAB_001017b9:
          fprintf(_stderr,pcVar12,uVar7);
          goto LAB_001017df;
        }
        uVar5 = raw1394_get_local_id(handle);
        if (bVar2) {
          uVar8 = raw1394_get_libversion();
          printf("libraw1394_version = %s  local_node_id = %x\n",uVar8,(ulong)uVar5 & 0xffff);
        }
        uVar4 = raw1394_get_nodecount(handle);
        iVar11 = (int)local_48;
        uVar6 = local_48 & 0xffff;
        if ((short)local_48 == 0x3f) {
          puts("**** Warning: Broadcasting message ");
          printf("     Address should be larger than CSR_CONFIG_ROM_END(0x%llx)\n",0xfffff0000800);
          iVar11 = (int)local_48;
        }
        else if ((int)uVar4 <= (int)uVar6) {
          pcVar12 = "**** Error: node %d does not exist (num nodes = %d)\n";
          goto LAB_001017d8;
        }
        __ptr = local_50;
        uVar5 = (uVar5 & 0xffffffc0) + iVar11;
        bVar2 = 2 < uVar14;
        if (pcVar12 != (char *)0x0) {
          bVar2 = uVar14 != 1;
        }
        if (bVar2) {
          uVar5 = uVar5 & 0xffff;
          if ((short)iVar11 == 0x3f) {
            iVar11 = raw1394_start_write(handle,uVar5,local_40,(long)(iVar3 << 2),local_50,0xb);
          }
          else {
            iVar11 = raw1394_write(handle,uVar5,local_40,(long)(iVar3 << 2),local_50);
          }
          if (iVar11 == 0) goto LAB_0010168f;
        }
        else {
          if ((short)iVar11 == 0x3f) {
            fprintf(_stderr,"**** Error: broadcast read NOT supported on node %d (num nodes = %d)\n"
                    ,uVar6,(ulong)uVar4);
          }
          iVar11 = raw1394_read(handle,uVar5 & 0xffff,local_40,(long)(iVar3 * 4),__ptr);
          if (iVar11 == 0) {
            uVar7 = uVar7 & 0xffffffff;
            if (iVar3 < 1) {
              uVar7 = 0;
            }
            for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
              uVar14 = __ptr[uVar6];
              printf("0x%08X\n",
                     (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                            uVar14 << 0x18));
            }
            goto LAB_0010168f;
          }
        }
        __stream = _stderr;
        puVar9 = (uint *)__errno_location();
        uVar14 = *puVar9;
        pcVar12 = strerror(uVar14);
        fprintf(__stream,"**** Error: errno = %d %s \n",(ulong)uVar14,pcVar12);
LAB_0010168f:
        if (__ptr != &data1) {
          free(__ptr);
        }
        raw1394_destroy_handle(handle);
        return 0;
      }
      pcVar12 = "**** Error: port %d does not exist (num ports = %d)\n";
      uVar6 = (ulong)local_58;
LAB_001017d8:
      fprintf(_stderr,pcVar12,uVar6,(ulong)uVar4);
      goto LAB_001017df;
    }
    pcVar12 = "**** Error: could not get port info\n";
    sStack_70 = 0x24;
  }
  fwrite(pcVar12,sStack_70,1,_stderr);
LAB_001017df:
  exit(-1);
}

Assistant:

int main(int argc, char** argv)
{
    int i, j, rc, args_found;
    int nports;
    int port;
    nodeid_t node;
    nodeaddr_t addr;
    int size;
    quadlet_t data1;
    quadlet_t *data = &data1;

    signal(SIGINT, signal_handler);

    int isQuad1394 = (strstr(argv[0], "quad1394") != 0);
    int isBroadcast = 0;
    int isDebug = 0;

    port = 0;
    node = 0;
    size = 1;
    j = 0;
    args_found = 0;
    for (i = 1; i < argc; i++) {
        if (argv[i][0] == '-') {
            if (argv[i][1] == 'p') {
                port = atoi(argv[i]+2);
                printf("Selecting port %d\n", port);
            }
            else if (argv[i][1] == 'n') {
                node = atoi(argv[i]+2);
                printf("Selecting node %d\n", node);
            }
            else if (argv[i][1] == 'd') {
                isDebug = 1;
            }
        }
        else {
            if (args_found == 0)
                addr = strtoull(argv[i], 0, 16);
            else if ((args_found == 1) && (isQuad1394))
                data1 = bswap_32(strtoul(argv[i], 0, 16));
            else if ((args_found == 1) && (!isQuad1394)) {
                size = strtoul(argv[i], 0, 10);
                /* Allocate data array, initializing contents to 0 */
                data = (quadlet_t *) calloc(sizeof(quadlet_t), size);
                if (!data) {
                    fprintf(stderr, "Failed to allocate memory for %d quadlets", size);
                    exit(-1);
                }
            }
            else if (!isQuad1394 && (j < size))
                data[j++] = bswap_32(strtoul(argv[i], 0, 16));
            else
                fprintf(stderr, "Warning: extra parameter: %s\n", argv[i]);

            args_found++;
        }
    }

    if (args_found < 1) {
        if (isQuad1394)
            printf("Usage: %s [-pP] [-nN] <address in hex> [value to write in hex]\n", argv[0]);
        else
            printf("Usage: %s [-pP] [-nN] <address in hex> <size in quadlets> [write data quadlets in hex]\n", argv[0]);
        printf("       where P = port number, N = node number\n");
        exit(0);
    }

    /* get handle to device and check for errors */
    handle = raw1394_new_handle();
    if (handle == NULL) {
        fprintf(stderr, "**** Error: could not open 1394 handle\n");
        exit(-1);
    }

    /* set the bus reset handler */
    raw1394_set_bus_reset_handler(handle, reset_handler);

    /* get number of ports and check for errors */
    nports = raw1394_get_port_info(handle, NULL, 0);
    if (nports < 0) {
        fprintf(stderr, "**** Error: could not get port info\n");
        exit(-1);
    }
    if ((port < 0) || (port >= nports)) {
        fprintf(stderr, "**** Error: port %d does not exist (num ports = %d)\n", port, nports);
        exit(-1);
    }

    /* set handle to current port and skip errors */
    rc = raw1394_set_port(handle, port);
    if (rc) {
        fprintf(stderr, "**** Error setting port %d\n", port);
        exit(-1);
    }

    // get local id and printf libraw1394 version & local_node_id for debugging
    nodeid_t id = raw1394_get_local_id(handle);
    if (isDebug) {
        printf("libraw1394_version = %s  local_node_id = %x\n", raw1394_get_libversion(), id);
    }

    /* get number of nodes connected to current port/handle */
    int nnodes = raw1394_get_nodecount(handle);
    //    bool
    if (node == 63) {
        isBroadcast = 1;
        printf("**** Warning: Broadcasting message \n");
        printf("     Address should be larger than CSR_CONFIG_ROM_END(0x%llx)\n", CSR_CONFIG_ROM_END + CSR_REGISTER_BASE);
    } else if ((node < 0) || (node >= nnodes)) {
        fprintf(stderr, "**** Error: node %d does not exist (num nodes = %d)\n", node, nnodes);
        exit(-1);
    }
    nodeid_t target_node = (id & 0xFFC0)+node;

    /* determine whether to read or write based on args_found */
    if ((isQuad1394 && (args_found == 1)) ||
            (!isQuad1394 && (args_found <= 2)))
    {
        if (isBroadcast) {
            fprintf(stderr, "**** Error: broadcast read NOT supported on node %d (num nodes = %d)\n", node, nnodes);
        }

        /* read the data block and print out the values */
        rc = raw1394_read(handle, target_node, addr, size*4, data);
        if (!rc) {
            for (j=0; j<size; j++)
                printf("0x%08X\n", bswap_32(data[j]));
        }
    } else {
        /* for write */
        if (isBroadcast) {
            // broadcast, no ack is expected
            rc = raw1394_start_write(handle, target_node, addr, size*4, data, 11);
        } else {
            // asynchronous write
            rc = raw1394_write(handle, target_node, addr, size*4, data);
        }
    }
    if (rc) {
        fprintf(stderr, "**** Error: errno = %d %s \n", errno, strerror(errno));
    }

    // Free memory if it was dynamically allocated
    if (data != &data1)
        free(data);

    raw1394_destroy_handle(handle);
    return 0;
}